

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaNormalTargetGenerator.cxx
# Opt level: O2

string * __thiscall
cmNinjaNormalTargetGenerator::LanguageLinkerCudaDeviceCompileRule
          (string *__return_storage_ptr__,cmNinjaNormalTargetGenerator *this,string *config)

{
  string *name;
  char local_c1;
  string local_c0;
  string local_a0;
  cmAlphaNum local_80;
  cmAlphaNum local_50;
  
  TargetLinkLanguage(&local_a0,this,config);
  local_50.View_._M_len = local_a0._M_string_length;
  local_50.View_._M_str = local_a0._M_dataplus._M_p;
  local_80.View_._M_len = 0x16;
  local_80.View_._M_str = "_DEVICE_LINK_COMPILE__";
  name = cmGeneratorTarget::GetName_abi_cxx11_
                   ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                    GeneratorTarget);
  cmGlobalNinjaGenerator::EncodeRuleName(&local_c0,name);
  local_c1 = '_';
  cmStrCat<std::__cxx11::string,char,std::__cxx11::string>
            (__return_storage_ptr__,&local_50,&local_80,&local_c0,&local_c1,config);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  return __return_storage_ptr__;
}

Assistant:

std::string cmNinjaNormalTargetGenerator::LanguageLinkerCudaDeviceCompileRule(
  const std::string& config) const
{
  return cmStrCat(
    this->TargetLinkLanguage(config), "_DEVICE_LINK_COMPILE__",
    cmGlobalNinjaGenerator::EncodeRuleName(this->GeneratorTarget->GetName()),
    '_', config);
}